

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O2

int __thiscall Imf_3_2::Image::levelWidth(Image *this,int lx)

{
  int iVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((-1 < lx) && (lx < (int)(this->_levels)._sizeY)) {
    iVar1 = anon_unknown_8::levelSize
                      ((this->_dataWindow).min.x,(this->_dataWindow).max.x,lx,
                       this->_levelRoundingMode);
    return iVar1;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_188,"Cannot get level width for invalid image level number ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lx);
  std::operator<<(poVar2,".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

int
Image::levelWidth (int lx) const
{
    if (lx < 0 || lx >= numXLevels ())
    {
        THROW (
            ArgExc,
            "Cannot get level width for invalid "
            "image level number "
                << lx << ".");
    }

    return levelSize (
        _dataWindow.min.x, _dataWindow.max.x, lx, _levelRoundingMode);
}